

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O2

void __thiscall deqp::gls::FragmentOpUtil::QuadRenderer::render(QuadRenderer *this,Quad *quad)

{
  int iVar1;
  undefined4 extraout_var;
  deUint8 indices [6];
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  undefined1 local_a8 [8];
  IndexType local_a0;
  deUint8 *local_98;
  undefined8 local_58;
  float local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  float local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  float local_30;
  undefined4 local_2c;
  undefined8 local_28;
  float local_20;
  undefined4 local_1c;
  
  local_58 = *(undefined8 *)(quad->posA).m_data;
  local_48 = (undefined4)local_58;
  local_34 = (undefined4)((ulong)local_58 >> 0x20);
  local_50 = quad->depth[0];
  local_4c = 0x3f800000;
  local_40 = quad->depth[1];
  local_3c = 0x3f800000;
  local_30 = quad->depth[2];
  local_2c = 0x3f800000;
  local_28 = *(undefined8 *)(quad->posB).m_data;
  local_38 = (undefined4)local_28;
  local_44 = (undefined4)((ulong)local_28 >> 0x20);
  local_20 = quad->depth[3];
  local_1c = 0x3f800000;
  indices[4] = '\x02';
  indices[5] = '\x03';
  indices[0] = '\0';
  indices[1] = '\x02';
  indices[2] = '\x01';
  indices[3] = '\x01';
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  glu::va::Float((VertexArrayBinding *)local_a8,this->m_positionLoc,4,4,0,(float *)&local_58);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)local_a8);
  std::__cxx11::string::~string((string *)&local_a0);
  glu::va::Float((VertexArrayBinding *)local_a8,this->m_colorLoc,4,4,0,quad->color[0].m_data);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)local_a8);
  std::__cxx11::string::~string((string *)&local_a0);
  if (this->m_blendFuncExt == true) {
    glu::va::Float((VertexArrayBinding *)local_a8,this->m_color1Loc,4,4,0,quad->color1[0].m_data);
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
    emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)local_a8);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1680))((this->m_program->m_program).m_program);
  local_a8 = (undefined1  [8])0x600000000;
  local_a0 = INDEXTYPE_UINT8;
  local_98 = indices;
  glu::draw(this->m_context,(this->m_program->m_program).m_program,
            (int)(((long)vertexArrays.
                         super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)vertexArrays.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x50),
            vertexArrays.
            super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
            _M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)local_a8,
            (DrawUtilCallback *)0x0);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            (&vertexArrays);
  return;
}

Assistant:

void QuadRenderer::render (const Quad& quad) const
{
	const float position[] =
	{
		quad.posA.x(), quad.posA.y(), quad.depth[0], 1.0f,
		quad.posA.x(), quad.posB.y(), quad.depth[1], 1.0f,
		quad.posB.x(), quad.posA.y(), quad.depth[2], 1.0f,
		quad.posB.x(), quad.posB.y(), quad.depth[3], 1.0f
	};
	const deUint8 indices[] = { 0, 2, 1, 1, 2, 3 };

	DE_STATIC_ASSERT(sizeof(tcu::Vec4) == sizeof(float)*4);
	DE_STATIC_ASSERT(sizeof(quad.color) == sizeof(float)*4*4);
	DE_STATIC_ASSERT(sizeof(quad.color1) == sizeof(float)*4*4);

	std::vector<glu::VertexArrayBinding> vertexArrays;

	vertexArrays.push_back(glu::va::Float(m_positionLoc,	4, 4, 0, &position[0]));
	vertexArrays.push_back(glu::va::Float(m_colorLoc,		4, 4, 0, (const float*)&quad.color[0]));

	if (m_blendFuncExt)
		vertexArrays.push_back(glu::va::Float(m_color1Loc,	4, 4, 0, (const float*)&quad.color1[0]));

	m_context.getFunctions().useProgram(m_program->getProgram());
	glu::draw(m_context, m_program->getProgram(),
			  (int)vertexArrays.size(), &vertexArrays[0],
			  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
}